

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
          (Block2LevelStructArrayCase *this,Context *context,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances)

{
  deqp::gls::UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,context->m_testCtx,context->m_renderCtx,name,
             glcts::fixed_sample_locations_values + 1,GLSL_VERSION_310_ES,layoutFlags);
  (this->super_UniformBlockCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_01e55668;
  this->m_layoutFlags = (deUint32)description;
  this->m_numInstances = bufferMode;
  return;
}

Assistant:

Block2LevelStructArrayCase (Context& context, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances)
		: UniformBlockCase	(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, bufferMode)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
	}